

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::
SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
::emplace_back<int,int>
          (SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>>
           *this,int *args,int *args_1)

{
  int iVar1;
  ulong uVar2;
  pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *__result;
  reference ppVar3;
  reference extraout_RAX;
  pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *__result_00;
  ulong uVar4;
  pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *__last;
  pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *__first;
  pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *__last_00;
  
  uVar2 = *(ulong *)(this + 8);
  __last_00 = (pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *)
              (*(long *)this + uVar2 * 0x10);
  if (uVar2 == *(ulong *)(this + 0x10)) {
    if (uVar2 == 0x7ffffffffffffff) {
      detail::throwLengthError();
    }
    uVar4 = uVar2 + 1;
    if (uVar2 + 1 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0x7ffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0x7ffffffffffffff;
    }
    __result = (pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *)
               operator_new(uVar4 << 4);
    iVar1 = *args;
    __result[uVar2].first.constructed = true;
    __result[uVar2].first.value = iVar1;
    iVar1 = *args_1;
    __result[uVar2].second.constructed = true;
    __result[uVar2].second.value = iVar1;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    __first = *(pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> **)
               this;
    __last = __first + *(long *)(this + 8);
    __result_00 = __result;
    if (__last != __last_00) {
      std::
      uninitialized_move<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>*,std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>*>
                (__first,__last_00,__result);
      __last = (pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> *)
               (*(long *)(this + 8) * 0x10 + *(long *)this);
      __result_00 = __result + uVar2 + 1;
      __first = __last_00;
    }
    std::
    uninitialized_move<std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>*,std::pair<(anonymous_namespace)::Constructable,(anonymous_namespace)::Constructable>*>
              (__first,__last,__result_00);
    SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
    ::cleanup((SmallVectorBase<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>_>
               *)this,(EVP_PKEY_CTX *)__last);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable> **)this =
         __result;
    ppVar3 = extraout_RAX;
  }
  else {
    iVar1 = *args;
    (__last_00->first).constructed = true;
    (__last_00->first).value = iVar1;
    iVar1 = *args_1;
    (__last_00->second).constructed = true;
    (__last_00->second).value = iVar1;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    ppVar3 = (reference)(uVar2 + 1);
    *(reference *)(this + 8) = ppVar3;
  }
  return ppVar3;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }